

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PartsBupOutputter.cpp
# Opt level: O2

void __thiscall
PartsBupOutputter::newFace
          (PartsBupOutputter *this,Image *img,Point pos,string *name,
          vector<MaskRect,_std::allocator<MaskRect>_> *mask)

{
  Blend BVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__source;
  allocator<char> local_101;
  string *local_100;
  path local_f8;
  vector<MaskRect,_std::allocator<MaskRect>_> *local_d0;
  Image *local_c8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<PartsBupOutputter::ImageEntry,_std::allocator<PartsBupOutputter::ImageEntry>_>_>
  local_c0;
  string local_88;
  _Vector_base<MaskRect,_std::allocator<MaskRect>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_c8 = &this->base;
  Image::operator=(&this->withFace,local_c8);
  std::__cxx11::string::assign((char *)&this->withMouthName);
  this->mouthBlend = AlphaBlend;
  this->facePos = pos;
  if ((img->colorData).super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
      super__Vector_impl_data._M_start ==
      (img->colorData).super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    std::__cxx11::string::assign((char *)&this->withFaceName);
    this->faceBlend = AlphaBlend;
  }
  else {
    local_100 = name;
    local_d0 = mask;
    std::vector<MaskRect,_std::allocator<MaskRect>_>::vector
              ((vector<MaskRect,_std::allocator<MaskRect>_> *)&local_68,mask);
    Image::drawOnto(img,&this->withFace,pos,(vector<MaskRect,_std::allocator<MaskRect>_> *)&local_68
                   );
    std::_Vector_base<MaskRect,_std::allocator<MaskRect>_>::~_Vector_base(&local_68);
    std::operator+(&local_f8._M_pathname,&this->baseName,"_");
    std::operator+(&local_c0.first,&local_f8._M_pathname,local_100);
    std::__cxx11::string::operator=((string *)&this->withFaceName,(string *)&local_c0);
    std::__cxx11::string::~string((string *)&local_c0);
    std::__cxx11::string::~string((string *)&local_f8);
    BVar1 = prepareImageInTmp(this,img,pos,local_d0,local_c8);
    this->faceBlend = BVar1;
    std::operator+(&local_50,&this->withFaceName,".png");
    std::filesystem::__cxx11::u8path<std::__cxx11::string,std::filesystem::__cxx11::path,char>
              (&local_f8,(__cxx11 *)&local_50,__source);
    std::filesystem::__cxx11::operator/((path *)&local_c0,&this->partsPath,&local_f8);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"",&local_101);
    name = local_100;
    Image::writePNG(&this->tmp,(path *)&local_c0,&local_88);
    std::__cxx11::string::~string((string *)&local_88);
    std::filesystem::__cxx11::path::~path((path *)&local_c0);
    std::filesystem::__cxx11::path::~path(&local_f8);
    std::__cxx11::string::~string((string *)&local_50);
  }
  local_f8._M_pathname._M_dataplus._M_p = (pointer)0x0;
  local_f8._M_pathname._M_string_length = 0;
  local_f8._M_pathname.field_2._M_allocated_capacity = 0;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<PartsBupOutputter::ImageEntry,_std::allocator<PartsBupOutputter::ImageEntry>_>_>
  ::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<PartsBupOutputter::ImageEntry,_std::allocator<PartsBupOutputter::ImageEntry>_>,_true>
            (&local_c0,name,
             (vector<PartsBupOutputter::ImageEntry,_std::allocator<PartsBupOutputter::ImageEntry>_>
              *)&local_f8);
  std::
  vector<std::pair<std::__cxx11::string,std::vector<PartsBupOutputter::ImageEntry,std::allocator<PartsBupOutputter::ImageEntry>>>,std::allocator<std::pair<std::__cxx11::string,std::vector<PartsBupOutputter::ImageEntry,std::allocator<PartsBupOutputter::ImageEntry>>>>>
  ::
  emplace_back<std::pair<std::__cxx11::string,std::vector<PartsBupOutputter::ImageEntry,std::allocator<PartsBupOutputter::ImageEntry>>>>
            ((vector<std::pair<std::__cxx11::string,std::vector<PartsBupOutputter::ImageEntry,std::allocator<PartsBupOutputter::ImageEntry>>>,std::allocator<std::pair<std::__cxx11::string,std::vector<PartsBupOutputter::ImageEntry,std::allocator<PartsBupOutputter::ImageEntry>>>>>
              *)&this->expressions,&local_c0);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<PartsBupOutputter::ImageEntry,_std::allocator<PartsBupOutputter::ImageEntry>_>_>
  ::~pair(&local_c0);
  std::vector<PartsBupOutputter::ImageEntry,_std::allocator<PartsBupOutputter::ImageEntry>_>::
  ~vector((vector<PartsBupOutputter::ImageEntry,_std::allocator<PartsBupOutputter::ImageEntry>_> *)
          &local_f8);
  return;
}

Assistant:

void newFace(const Image& img, Point pos, const std::string &name, const std::vector<MaskRect>& mask) override {
		withFace = base;
		withMouthName = "";
		mouthBlend = Blend::AlphaBlend;
		facePos = pos;
		if (img.empty()) {
			withFaceName = "";
			faceBlend = Blend::AlphaBlend;
		}
		else {
			img.drawOnto(withFace, pos, mask);
			withFaceName = baseName + "_" + name;
			faceBlend = prepareImageInTmp(img, pos, mask, base);
			tmp.writePNG(partsPath/fs::u8path(withFaceName + ".png"));
		}
		expressions.push_back({name, {}});
	}